

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::addName(Builder *this,Id id,char *string)

{
  Instruction *this_00;
  value_type local_30;
  Instruction *local_28;
  Instruction *name;
  char *string_local;
  Builder *pBStack_10;
  Id id_local;
  Builder *this_local;
  
  name = (Instruction *)string;
  string_local._4_4_ = id;
  pBStack_10 = this;
  this_00 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(this_00,OpName);
  local_28 = this_00;
  spv::Instruction::reserveOperands(this_00,2);
  spv::Instruction::addIdOperand(local_28,string_local._4_4_);
  spv::Instruction::addStringOperand(local_28,(char *)name);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
             local_28);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->names,&local_30);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void Builder::addName(Id id, const char* string)
{
    Instruction* name = new Instruction(OpName);
    name->reserveOperands(2);
    name->addIdOperand(id);
    name->addStringOperand(string);

    names.push_back(std::unique_ptr<Instruction>(name));
}